

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::cbtAxisSweep3Internal
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *worldAabbMin,
          cbtVector3 *worldAabbMax,unsigned_short handleMask,unsigned_short handleSentinel,
          unsigned_short userMaxHandles,cbtOverlappingPairCache *pairCache,
          bool disableRaycastAccelerator)

{
  Edge *pEVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  cbtHashedOverlappingPairCache *this_00;
  cbtOverlappingPairCache *pcVar4;
  cbtDbvtBroadphase *this_01;
  Handle *pHVar5;
  Handle *pHVar6;
  undefined2 *puVar7;
  void *pvVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [56];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [12];
  undefined1 in_ZMM2 [64];
  undefined1 auVar20 [16];
  cbtVector3 cVar21;
  
  auVar19 = in_ZMM2._4_12_;
  uVar9 = userMaxHandles + 1;
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtAxisSweep3Internal_01193170;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (cbtOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (cbtDbvtBroadphase *)0x0;
  if (pairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  if (!disableRaycastAccelerator) {
    pcVar4 = (cbtOverlappingPairCache *)cbtAlignedAllocInternal(0x28,0x10);
    pcVar4[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[2].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[3].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    (pcVar4->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback =
         (_func_int **)&PTR__cbtNullPairCache_011931f0;
    *(undefined1 *)&pcVar4[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = 1;
    *(undefined4 *)
     ((long)&pcVar4[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback + 4) = 0;
    this->m_nullPairCache = pcVar4;
    this_01 = (cbtDbvtBroadphase *)cbtAlignedAllocInternal(0x100,0x10);
    cbtDbvtBroadphase::cbtDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar3 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar3;
  uVar11 = *(ulong *)(worldAabbMax->m_floats + 2);
  auVar16 = ZEXT856(uVar11);
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(ulong *)((this->m_worldAabbMax).m_floats + 2) = uVar11;
  cVar21 = ::operator-(&this->m_worldAabbMax,&this->m_worldAabbMin);
  auVar13._0_8_ = cVar21.m_floats._0_8_;
  auVar13._8_56_ = auVar16;
  uVar11 = (ulong)(uint)uVar9;
  fVar18 = (float)this->m_handleSentinel;
  auVar20._4_4_ = fVar18;
  auVar20._0_4_ = fVar18;
  auVar20._8_4_ = fVar18;
  auVar20._12_4_ = fVar18;
  auVar17._0_4_ = fVar18 / cVar21.m_floats[2];
  auVar17._4_12_ = auVar19;
  auVar20 = vdivps_avx(auVar20,auVar13._0_16_);
  auVar20 = vinsertps_avx(auVar20,auVar17,0x28);
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar20;
  pHVar5 = (Handle *)Handle::operator_new__(uVar11 * 0x48);
  if (uVar9 != 0) {
    uVar10 = 0;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar2 = vpmovsxwd_avx2(_DAT_00f5c280);
    auVar14 = vpbroadcastq_avx512f();
    pHVar6 = pHVar5;
    do {
      auVar15 = vpbroadcastq_avx512f();
      uVar10 = uVar10 + 8;
      auVar15 = vporq_avx512f(auVar15,auVar13);
      uVar3 = vpcmpuq_avx512f(auVar15,auVar14,2);
      vpscatterdq_avx512f(ZEXT864(pHVar6) + ZEXT3264(auVar2),uVar3,ZEXT1664(ZEXT816(0) << 0x40));
      pHVar6 = pHVar6 + 8;
    } while (((uVar11 * 0x48 - 0x48) / 0x48 + 8 & 0x7fffffffffffff8) != uVar10);
  }
  this->m_pHandles = pHVar5;
  this->m_maxHandles = uVar9;
  this->m_numHandles = 0;
  puVar7 = (undefined2 *)&pHVar5[1].super_cbtBroadphaseProxy.field_0x34;
  this->m_firstFreeHandle = 1;
  uVar10 = 1;
  while (uVar10 < uVar11) {
    uVar10 = uVar10 + 1;
    *puVar7 = (short)uVar10;
    puVar7 = puVar7 + 0x24;
  }
  *(undefined2 *)&pHVar5[uVar11 - 1].super_cbtBroadphaseProxy.field_0x34 = 0;
  for (lVar12 = -0x18; lVar12 != 0; lVar12 = lVar12 + 8) {
    pvVar8 = cbtAlignedAllocInternal((ulong)((uint)uVar9 * 8),0x10);
    *(void **)((long)this->m_pEdgesRawPtr + lVar12 + 0x18) = pvVar8;
    *(void **)((long)this->m_pEdgesRawPtr + lVar12) = pvVar8;
  }
  pHVar5 = this->m_pHandles;
  (pHVar5->super_cbtBroadphaseProxy).m_clientObject = (void *)0x0;
  for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
    pHVar5->m_maxEdges[lVar12 + -3] = 0;
    pHVar5->m_maxEdges[lVar12] = 1;
    pEVar1 = this->m_pEdges[lVar12];
    pEVar1->m_pos = 0;
    pEVar1->m_handle = 0;
    pEVar1[1].m_pos = this->m_handleSentinel;
    pEVar1[1].m_handle = 0;
  }
  return;
}

Assistant:

cbtAxisSweep3Internal<BP_FP_INT_TYPE>::cbtAxisSweep3Internal(const cbtVector3& worldAabbMin, const cbtVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel, BP_FP_INT_TYPE userMaxHandles, cbtOverlappingPairCache* pairCache, bool disableRaycastAccelerator)
	: m_bpHandleMask(handleMask),
	  m_handleSentinel(handleSentinel),
	  m_pairCache(pairCache),
	  m_userPairCallback(0),
	  m_ownsPairCache(false),
	  m_invalidPair(0),
	  m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles + 1);  //need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (ptr) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (cbtAlignedAlloc(sizeof(cbtNullPairCache), 16)) cbtNullPairCache();
		m_raycastAccelerator = new (cbtAlignedAlloc(sizeof(cbtDbvtBroadphase), 16)) cbtDbvtBroadphase(m_nullPairCache);  //m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;                                                                //don't add/remove pairs
	}

	//cbtAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	cbtVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE maxInt = m_handleSentinel;

	m_quantize = cbtVector3(cbtScalar(maxInt), cbtScalar(maxInt), cbtScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using cbtAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];

	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = cbtAlignedAlloc(sizeof(Edge) * maxHandles * 2, 16);
			m_pEdges[i] = new (m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels

	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
	}
}